

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O1

int mbedtls_x509_crl_info(char *buf,size_t size,char *prefix,mbedtls_x509_crl *crl)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  mbedtls_x509_crl_entry *pmVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  
  uVar1 = snprintf(buf,size,"%sCRL version   : %d",prefix,(ulong)(uint)crl->version);
  iVar2 = -0x2980;
  if (-1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
    uVar5 = size - uVar3;
    if (uVar3 <= size && uVar5 != 0) {
      pcVar8 = buf + uVar3;
      uVar1 = snprintf(pcVar8,uVar5,"\n%sissuer name   : ",prefix);
      if (-1 < (int)uVar1) {
        uVar3 = (ulong)uVar1;
        uVar6 = uVar5 - uVar3;
        if (uVar3 <= uVar5 && uVar6 != 0) {
          pcVar8 = pcVar8 + uVar3;
          uVar1 = mbedtls_x509_dn_gets(pcVar8,uVar6,&crl->issuer);
          if (-1 < (int)uVar1) {
            uVar3 = (ulong)uVar1;
            uVar5 = uVar6 - uVar3;
            if (uVar3 <= uVar6 && uVar5 != 0) {
              pcVar8 = pcVar8 + uVar3;
              uVar1 = snprintf(pcVar8,uVar5,"\n%sthis update   : %04d-%02d-%02d %02d:%02d:%02d",
                               prefix,(ulong)(uint)(crl->this_update).year,
                               (ulong)(uint)(crl->this_update).mon,
                               (ulong)(uint)(crl->this_update).day,
                               (ulong)(uint)(crl->this_update).hour,
                               (ulong)(uint)(crl->this_update).min,
                               (ulong)(uint)(crl->this_update).sec);
              if (-1 < (int)uVar1) {
                uVar3 = (ulong)uVar1;
                uVar6 = uVar5 - uVar3;
                if (uVar3 <= uVar5 && uVar6 != 0) {
                  pcVar8 = pcVar8 + uVar3;
                  uVar1 = snprintf(pcVar8,uVar6,"\n%snext update   : %04d-%02d-%02d %02d:%02d:%02d",
                                   prefix,(ulong)(uint)(crl->next_update).year,
                                   (ulong)(uint)(crl->next_update).mon,
                                   (ulong)(uint)(crl->next_update).day,
                                   (ulong)(uint)(crl->next_update).hour,
                                   (ulong)(uint)(crl->next_update).min,
                                   (ulong)(uint)(crl->next_update).sec);
                  if (-1 < (int)uVar1) {
                    uVar3 = (ulong)uVar1;
                    uVar5 = uVar6 - uVar3;
                    if (uVar3 <= uVar6 && uVar5 != 0) {
                      uVar1 = snprintf(pcVar8 + uVar3,uVar5,"\n%sRevoked certificates:",prefix);
                      if (-1 < (int)uVar1) {
                        uVar6 = (ulong)uVar1;
                        uVar7 = uVar5 - uVar6;
                        if (uVar6 <= uVar5 && uVar7 != 0) {
                          pmVar4 = &crl->entry;
                          pcVar8 = pcVar8 + uVar3 + uVar6;
                          do {
                            if ((pmVar4->raw).len == 0) break;
                            uVar1 = snprintf(pcVar8,uVar7,"\n%sserial number: ",prefix);
                            if ((int)uVar1 < 0) {
                              return -0x2980;
                            }
                            uVar3 = (ulong)uVar1;
                            uVar5 = uVar7 - uVar3;
                            if (uVar7 < uVar3 || uVar5 == 0) {
                              return -0x2980;
                            }
                            pcVar8 = pcVar8 + uVar3;
                            uVar1 = mbedtls_x509_serial_gets(pcVar8,uVar5,&pmVar4->serial);
                            if ((int)uVar1 < 0) {
                              return -0x2980;
                            }
                            uVar3 = (ulong)uVar1;
                            uVar6 = uVar5 - uVar3;
                            if (uVar5 < uVar3 || uVar6 == 0) {
                              return -0x2980;
                            }
                            uVar1 = snprintf(pcVar8 + uVar3,uVar6,
                                             " revocation date: %04d-%02d-%02d %02d:%02d:%02d",
                                             (ulong)(uint)(pmVar4->revocation_date).year,
                                             (ulong)(uint)(pmVar4->revocation_date).mon,
                                             (ulong)(uint)(pmVar4->revocation_date).day,
                                             (ulong)(uint)(pmVar4->revocation_date).hour,
                                             (ulong)(uint)(pmVar4->revocation_date).min,
                                             (ulong)(uint)(pmVar4->revocation_date).sec);
                            if ((int)uVar1 < 0) {
                              return -0x2980;
                            }
                            uVar5 = (ulong)uVar1;
                            uVar7 = uVar6 - uVar5;
                            if (uVar6 < uVar5 || uVar7 == 0) {
                              return -0x2980;
                            }
                            pcVar8 = pcVar8 + uVar3 + uVar5;
                            pmVar4 = pmVar4->next;
                          } while (pmVar4 != (mbedtls_x509_crl_entry *)0x0);
                          uVar1 = snprintf(pcVar8,uVar7,"\n%ssigned using  : ",prefix);
                          if (-1 < (int)uVar1) {
                            uVar3 = (ulong)uVar1;
                            uVar5 = uVar7 - uVar3;
                            if (uVar3 <= uVar7 && uVar5 != 0) {
                              uVar1 = mbedtls_x509_sig_alg_gets
                                                (pcVar8 + uVar3,uVar5,&crl->sig_oid,crl->sig_pk,
                                                 crl->sig_md,crl->sig_opts);
                              if (-1 < (int)uVar1) {
                                uVar6 = (ulong)uVar1;
                                uVar7 = uVar5 - uVar6;
                                if (((uVar6 <= uVar5 && uVar7 != 0) &&
                                    (uVar1 = snprintf(pcVar8 + uVar3 + uVar6,uVar7,
                                                      anon_var_dwarf_d9f5 + 8), -1 < (int)uVar1)) &&
                                   (uVar1 < uVar7)) {
                                  iVar2 = uVar1 + ((int)size - (int)uVar7);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crl_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_crl *crl )
{
    int ret;
    size_t n;
    char *p;
    const mbedtls_x509_crl_entry *entry;

    p = buf;
    n = size;

    ret = mbedtls_snprintf( p, n, "%sCRL version   : %d",
                               prefix, crl->version );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissuer name   : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crl->issuer );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sthis update   : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crl->this_update.year, crl->this_update.mon,
                   crl->this_update.day,  crl->this_update.hour,
                   crl->this_update.min,  crl->this_update.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%snext update   : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crl->next_update.year, crl->next_update.mon,
                   crl->next_update.day,  crl->next_update.hour,
                   crl->next_update.min,  crl->next_update.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    entry = &crl->entry;

    ret = mbedtls_snprintf( p, n, "\n%sRevoked certificates:",
                               prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    while( entry != NULL && entry->raw.len != 0 )
    {
        ret = mbedtls_snprintf( p, n, "\n%sserial number: ",
                               prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        ret = mbedtls_x509_serial_gets( p, n, &entry->serial );
        MBEDTLS_X509_SAFE_SNPRINTF;

        ret = mbedtls_snprintf( p, n, " revocation date: " \
                   "%04d-%02d-%02d %02d:%02d:%02d",
                   entry->revocation_date.year, entry->revocation_date.mon,
                   entry->revocation_date.day,  entry->revocation_date.hour,
                   entry->revocation_date.min,  entry->revocation_date.sec );
        MBEDTLS_X509_SAFE_SNPRINTF;

        entry = entry->next;
    }

    ret = mbedtls_snprintf( p, n, "\n%ssigned using  : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &crl->sig_oid, crl->sig_pk, crl->sig_md,
                             crl->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n" );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}